

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeNF
          (ChElementShellANCF_3423 *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  XprTypeNested pMVar7;
  scalar_constant_op<double> sVar8;
  scalar_constant_op<double> sVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  long index;
  uint i;
  long index_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double y;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChMatrix33<double> J_Cxi_Inv;
  ChVectorN<double,_3> M_scaled;
  Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_> QiCompact;
  VectorN G_C;
  ChMatrix33<double> J_Cxi;
  VectorN G_B;
  MatrixNx3 Sxi_D;
  VectorN G_A;
  ShapeVector Ny;
  ShapeVector N;
  MatrixNx3 e_bar;
  ShapeVector Nz;
  ShapeVector Nx;
  double local_860;
  double local_858;
  double local_850;
  double local_848;
  double local_840;
  double local_838;
  double local_830;
  double local_828;
  double local_820;
  undefined1 local_818 [16];
  XprTypeNested pMStack_808;
  variable_if_dynamic<long,__1> vStack_800;
  variable_if_dynamic<long,__1> vStack_7f8;
  Index IStack_7f0;
  scalar_constant_op<double> local_7e0;
  MapBase<Eigen::Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_>,_0> local_7d0;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_7c0;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_780;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_740;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_700;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_6c0 [8];
  PointerType local_6b8;
  XprTypeNested pMStack_6b0;
  XprTypeNested pMStack_6a8;
  long lStack_6a0;
  double dStack_698;
  XprTypeNested pMStack_690;
  undefined1 local_660 [16];
  XprTypeNested pMStack_650;
  variable_if_dynamic<long,__1> vStack_648;
  variable_if_dynamic<long,__1> vStack_640;
  Index IStack_638;
  Index IStack_630;
  undefined1 local_620 [16];
  XprTypeNested pMStack_610;
  variable_if_dynamic<long,__1> vStack_608;
  variable_if_dynamic<long,__1> vStack_600;
  Index IStack_5f8;
  scalar_constant_op<double> local_5e8;
  undefined1 local_5d0 [16];
  XprTypeNested pMStack_5c0;
  variable_if_dynamic<long,__1> vStack_5b8;
  variable_if_dynamic<long,__1> vStack_5b0;
  XprTypeNested pMStack_5a8;
  scalar_constant_op<double> local_598;
  Matrix<double,_3,_3,_1,_3,_3> local_588;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_540 [8];
  PointerType pdStack_538;
  double dStack_530;
  XprTypeNested local_528;
  long lStack_520;
  double dStack_518;
  XprTypeNested pMStack_510;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_500;
  undefined1 local_4b8 [24];
  scalar_constant_op<double> sStack_4a0;
  variable_if_dynamic<long,__1> local_498;
  variable_if_dynamic<long,__1> vStack_490;
  scalar_constant_op<double> sStack_488;
  XprTypeNested pMStack_480;
  double local_470;
  PointerType local_460;
  XprTypeNested pMStack_458;
  XprTypeNested pMStack_450;
  long lStack_448;
  Index IStack_440;
  Index IStack_438;
  double local_428;
  PointerType local_410;
  double dStack_408;
  XprTypeNested pMStack_400;
  long lStack_3f8;
  long lStack_3f0;
  Index IStack_3e8;
  double local_3d8;
  Matrix<double,_8,_3,_1,_8,_3> local_3c0;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_300 [64];
  ShapeVector local_2c0;
  ShapeVector local_280;
  PointerType local_240;
  PointerType pdStack_238;
  XprTypeNested pMStack_230;
  XprTypeNested pMStack_228;
  long lStack_220;
  double dStack_218;
  XprTypeNested pMStack_210;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_1f0;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_1c0 [4];
  undefined8 local_100;
  double local_f8;
  undefined8 local_f0;
  double local_e8;
  undefined8 local_e0;
  double local_d8;
  undefined8 local_d0;
  double local_c8;
  MatrixBase<Eigen::Matrix<double,1,8,1,1,8>> local_c0 [144];
  
  ShapeFunctions(this,&local_280,U,V,0.0);
  Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase(&local_7d0,
          (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,8,3)
  ;
  index = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_3c0,F,0,3);
  local_4b8._0_8_ = &local_280;
  vStack_490.m_value =
       (long)local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
             .array[4];
  sStack_488.m_other =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
       [5];
  pMStack_480 = (XprTypeNested)
                local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[6];
  local_4b8._8_8_ =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
       [0];
  local_4b8._16_8_ =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
       [1];
  sStack_4a0.m_other =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
       [2];
  local_498.m_value =
       (long)local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
             .array[3];
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,8,3,1,8,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>>
            ((Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_> *)&local_7d0,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
              *)local_4b8);
  y = V;
  ShapeFunctionsDerivativeX
            (this,(ShapeVector *)local_c0,
             local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
             .array[0],V,0.0);
  ShapeFunctionsDerivativeY(this,&local_2c0,U,y,0.0);
  local_100 = 0;
  local_c8 = (1.0 - U) * 0.25;
  local_d8 = (U + 1.0) * 0.25;
  local_f8 = local_c8 * (1.0 - V);
  local_e8 = local_d8 * (1.0 - V);
  local_d8 = local_d8 * (V + 1.0);
  local_c8 = local_c8 * (V + 1.0);
  local_f0 = 0;
  local_e0 = 0;
  local_d0 = 0;
  Eigen::MatrixBase<Eigen::Matrix<double,1,8,1,1,8>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)&local_588,local_c0,&this->m_lenX);
  local_860._0_4_ = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
               *)local_4b8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
               *)&local_588,(int *)&local_860);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(local_1c0,&local_3c0,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
            ((Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false> *)local_1c0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)local_4b8);
  Eigen::MatrixBase<Eigen::Matrix<double,1,8,1,1,8>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)&local_588,(MatrixBase<Eigen::Matrix<double,1,8,1,1,8>> *)&local_2c0,&this->m_lenY);
  local_860._0_4_ = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
               *)local_4b8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
               *)&local_588,(int *)&local_860);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(local_1c0,&local_3c0,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
            ((Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false> *)local_1c0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)local_4b8);
  Eigen::MatrixBase<Eigen::Matrix<double,1,8,1,1,8>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)&local_588,(MatrixBase<Eigen::Matrix<double,1,8,1,1,8>> *)&local_100,
             &this->m_thickness);
  local_860._0_4_ = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
               *)local_4b8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
               *)&local_588,(int *)&local_860);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(local_1c0,&local_3c0,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
            ((Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false> *)local_1c0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)local_4b8);
  CalcCoordMatrix(this,(ChMatrixNM<double,_8,_3> *)local_1c0);
  local_4b8._0_8_ = local_1c0;
  local_4b8._8_8_ = &local_3c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_588,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
              *)local_4b8);
  local_4b8._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_588;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_860,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)local_4b8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> *)
                  local_660,&local_3c0,0);
  lStack_220 = vStack_640.m_value;
  dStack_218 = (double)IStack_638;
  local_240 = (PointerType)local_660._0_8_;
  pdStack_238 = (PointerType)local_660._8_8_;
  pMStack_230 = pMStack_650;
  pMStack_228 = (XprTypeNested)vStack_648.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_5d0,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_240,&local_860);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_740,&local_3c0,1);
  local_700.m_startCol.m_value = local_740.m_startCol.m_value;
  local_700.m_outerStride = local_740.m_outerStride;
  local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_700.m_xpr = local_740.m_xpr;
  local_700.m_startRow.m_value = local_740.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_818,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_700,&local_848);
  sVar9.m_other = local_598.m_other;
  sVar8.m_other = local_7e0.m_other;
  dStack_518 = (double)vStack_5b0.m_value;
  pMStack_510 = pMStack_5a8;
  local_6b8 = (PointerType)local_818._0_8_;
  pMStack_6b0 = (XprTypeNested)local_818._8_8_;
  pdStack_538 = (PointerType)local_5d0._0_8_;
  dStack_530 = (double)local_5d0._8_8_;
  local_528 = pMStack_5c0;
  lStack_520 = vStack_5b8.m_value;
  pMStack_6a8 = pMStack_808;
  lStack_6a0 = vStack_800.m_value;
  dStack_698 = (double)vStack_7f8.m_value;
  pMStack_690 = (XprTypeNested)IStack_7f0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_7c0,&local_3c0,2);
  local_780.m_startCol.m_value = local_7c0.m_startCol.m_value;
  local_780.m_outerStride = local_7c0.m_outerStride;
  local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_780.m_xpr = local_7c0.m_xpr;
  local_780.m_startRow.m_value = local_7c0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_620,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_780,&local_830);
  sStack_488.m_other = dStack_518;
  pMStack_480 = pMStack_510;
  local_4b8._16_8_ = pdStack_538;
  sStack_4a0.m_other = dStack_530;
  local_498.m_value = (long)local_528;
  vStack_490.m_value = lStack_520;
  local_470 = sVar9.m_other;
  local_460 = local_6b8;
  pMStack_458 = pMStack_6b0;
  pMStack_450 = pMStack_6a8;
  lStack_448 = lStack_6a0;
  IStack_440 = (Index)dStack_698;
  IStack_438 = (Index)pMStack_690;
  local_428 = sVar8.m_other;
  local_410 = (PointerType)local_620._0_8_;
  dStack_408 = (double)local_620._8_8_;
  pMStack_400 = pMStack_610;
  lStack_3f8 = vStack_608.m_value;
  lStack_3f0 = vStack_600.m_value;
  IStack_3e8 = IStack_5f8;
  local_3d8 = local_5e8.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_300,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_4b8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_700,&local_3c0,0);
  vStack_640.m_value = local_700.m_startCol.m_value;
  IStack_638 = local_700.m_outerStride;
  local_660._0_8_ =
       local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_660._8_8_ =
       local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  pMStack_650 = local_700.m_xpr;
  vStack_648.m_value = local_700.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_5d0,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )local_660,&local_858);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_780,&local_3c0,1);
  local_740.m_startCol.m_value = local_780.m_startCol.m_value;
  local_740.m_outerStride = local_780.m_outerStride;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_740.m_xpr = local_780.m_xpr;
  local_740.m_startRow.m_value = local_780.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_818,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_740,&local_840);
  sVar9.m_other = local_598.m_other;
  sVar8.m_other = local_7e0.m_other;
  dStack_698 = (double)vStack_5b0.m_value;
  pMStack_690 = pMStack_5a8;
  pdStack_238 = (PointerType)local_818._0_8_;
  pMStack_230 = (XprTypeNested)local_818._8_8_;
  local_6b8 = (PointerType)local_5d0._0_8_;
  pMStack_6b0 = (XprTypeNested)local_5d0._8_8_;
  pMStack_6a8 = pMStack_5c0;
  lStack_6a0 = vStack_5b8.m_value;
  pMStack_228 = pMStack_808;
  lStack_220 = vStack_800.m_value;
  dStack_218 = (double)vStack_7f8.m_value;
  pMStack_210 = (XprTypeNested)IStack_7f0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_500,&local_3c0,2);
  local_7c0.m_startCol.m_value = local_500.m_startCol.m_value;
  local_7c0.m_outerStride = local_500.m_outerStride;
  local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_500.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_500.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_7c0.m_xpr = local_500.m_xpr;
  local_7c0.m_startRow.m_value = local_500.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_620,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_7c0,&local_828);
  sStack_488.m_other = dStack_698;
  pMStack_480 = pMStack_690;
  local_4b8._16_8_ = local_6b8;
  sStack_4a0.m_other = (double)pMStack_6b0;
  local_498.m_value = (long)pMStack_6a8;
  vStack_490.m_value = lStack_6a0;
  local_470 = sVar9.m_other;
  local_460 = pdStack_238;
  pMStack_458 = pMStack_230;
  pMStack_450 = pMStack_228;
  lStack_448 = lStack_220;
  IStack_440 = (Index)dStack_218;
  IStack_438 = (Index)pMStack_210;
  local_428 = sVar8.m_other;
  local_410 = (PointerType)local_620._0_8_;
  dStack_408 = (double)local_620._8_8_;
  pMStack_400 = pMStack_610;
  lStack_3f8 = vStack_608.m_value;
  lStack_3f0 = vStack_600.m_value;
  IStack_3e8 = IStack_5f8;
  local_3d8 = local_5e8.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_540,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_4b8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_740,&local_3c0,0);
  local_700.m_startCol.m_value = local_740.m_startCol.m_value;
  local_700.m_outerStride = local_740.m_outerStride;
  local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_700.m_xpr = local_740.m_xpr;
  local_700.m_startRow.m_value = local_740.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_5d0,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_700,&local_850);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_7c0,&local_3c0,1);
  local_780.m_startCol.m_value = local_7c0.m_startCol.m_value;
  local_780.m_outerStride = local_7c0.m_outerStride;
  local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_780.m_xpr = local_7c0.m_xpr;
  local_780.m_startRow.m_value = local_7c0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_818,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_780,&local_838);
  dStack_218 = (double)vStack_5b0.m_value;
  pMStack_210 = pMStack_5a8;
  local_660._8_8_ = local_818._0_8_;
  pMStack_650 = (XprTypeNested)local_818._8_8_;
  pdStack_238 = (PointerType)local_5d0._0_8_;
  pMStack_230 = (XprTypeNested)local_5d0._8_8_;
  pMStack_228 = pMStack_5c0;
  lStack_220 = vStack_5b8.m_value;
  vStack_648.m_value = (long)pMStack_808;
  vStack_640.m_value = vStack_800.m_value;
  IStack_638 = vStack_7f8.m_value;
  IStack_630 = IStack_7f0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_1f0,&local_3c0,2);
  local_500.m_startCol.m_value = local_1f0.m_startCol.m_value;
  local_500.m_outerStride = local_1f0.m_outerStride;
  local_500.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_1f0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_500.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_1f0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_500.m_xpr = local_1f0.m_xpr;
  local_500.m_startRow.m_value = local_1f0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_620,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_500,&local_820);
  sStack_488.m_other = dStack_218;
  pMStack_480 = pMStack_210;
  local_4b8._16_8_ = pdStack_238;
  sStack_4a0.m_other = (double)pMStack_230;
  local_498.m_value = (long)pMStack_228;
  vStack_490.m_value = lStack_220;
  local_470 = local_598.m_other;
  local_460 = (PointerType)local_660._8_8_;
  pMStack_458 = pMStack_650;
  pMStack_450 = (XprTypeNested)vStack_648.m_value;
  lStack_448 = vStack_640.m_value;
  IStack_440 = IStack_638;
  IStack_438 = IStack_630;
  local_428 = local_7e0.m_other;
  local_410 = (PointerType)local_620._0_8_;
  dStack_408 = (double)local_620._8_8_;
  pMStack_400 = pMStack_610;
  lStack_3f8 = vStack_608.m_value;
  lStack_3f0 = vStack_600.m_value;
  IStack_3e8 = IStack_5f8;
  local_3d8 = local_5e8.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_6c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_4b8);
  local_620._0_8_ = (PointerType)0x3fe0000000000000;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_5d0,F,3,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)local_4b8,(double *)local_620,(StorageBaseType *)local_5d0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_818,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)local_4b8);
  for (index_00 = 0; uVar5 = local_818._8_8_, index_00 != 8; index_00 = index_00 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_6c0,
                         index_00);
    pMVar7 = pMStack_808;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_540,
                         index_00);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)pMVar7 * *pSVar10;
    auVar15 = vfmsub231sd_fma(auVar16,auVar12,auVar2);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index);
    pMVar7 = pMStack_808;
    *pSVar11 = auVar15._0_8_ + *pSVar11;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_300,
                         index_00);
    uVar5 = local_818._0_8_;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_6c0,
                         index_00);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pMVar7;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (double)uVar5 * *pSVar10;
    auVar15 = vfmsub231sd_fma(auVar17,auVar13,auVar3);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 1)
    ;
    uVar5 = local_818._0_8_;
    *pSVar11 = auVar15._0_8_ + *pSVar11;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_540,
                         index_00);
    uVar6 = local_818._8_8_;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_300,
                         index_00);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar5;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (double)uVar6 * *pSVar10;
    auVar15 = vfmsub231sd_fma(auVar18,auVar14,auVar4);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 2)
    ;
    index = index + 3;
    *pSVar11 = auVar15._0_8_ + *pSVar11;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  local_4b8,&local_588,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> *)
                  local_5d0,&local_588,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>>::
  cross<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>>
            ((type *)local_620,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>> *)local_4b8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false>_> *)
             local_5d0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (double)pMStack_610 * (double)pMStack_610 +
       (double)local_620._0_8_ * (double)local_620._0_8_ +
       (double)local_620._8_8_ * (double)local_620._8_8_;
  auVar15 = vsqrtsd_avx(auVar15,auVar15);
  *detJ = auVar15._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ShapeVector N;
    ShapeFunctions(N, U, V, 0);

    Eigen::Map<MatrixNx3> QiCompact(Qi.data(), NSF, 3);
    QiCompact = N.transpose() * F.segment(0, 3).transpose();

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctionsDerivativeX(Nx, U, V, 0);
    ShapeFunctionsDerivativeY(Ny, U, V, 0);
    ShapeFunctionsDerivativeZ(Nz, U, V, 0);

    // Change the shape function derivatives with respect to the element local "x", "y", or "z" coordinates to be with
    // respect to the normalized coordinates "xi", "eta", and "zeta" when loading the results into the Sxi_D matrix
    MatrixNx3 Sxi_D;
    Sxi_D.col(0) = Nx * m_lenX / 2;
    Sxi_D.col(1) = Ny * m_lenY / 2;
    Sxi_D.col(2) = Nz * m_thickness / 2;

    MatrixNx3 e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the element Jacobian between the current configuration and the normalized configuration
    ChMatrix33<double> J_Cxi = e_bar.transpose() * Sxi_D;
    ChMatrix33<double> J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i + 0) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi(3 * i + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi(3 * i + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential area and the normalized differential area.  The cross product is
    //  used to calculate this area ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.col(0).cross(J_Cxi.col(1)).norm();
}